

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
          (xpath_ast_node *this,xml_node_struct *ns,xml_node *xn,undefined8 param_4,byte once)

{
  bool bVar1;
  xml_node_struct *in_RAX;
  long lVar2;
  xpath_allocator *pxVar3;
  xpath_allocator *pxVar4;
  xml_node local_38;
  
  if (((long *)xn)[1] == 0) {
    local_38._root = xn->_root;
  }
  else {
    local_38._root = in_RAX;
    xml_node::xml_node(&local_38);
  }
  if (local_38._root == (xml_node_struct *)0x0) {
    pxVar3 = *(xpath_allocator **)xn;
    if (pxVar3 != (xpath_allocator *)0x0 && ((long *)xn)[1] != 0) {
      do {
        pxVar4 = (xpath_allocator *)pxVar3[1]._root_size;
        if ((xpath_allocator *)pxVar3[1]._root_size == (xpath_allocator *)0x0) {
          while (pxVar4 = (xpath_allocator *)pxVar3[2]._root,
                (xpath_allocator *)pxVar3[2]._root == (xpath_allocator *)0x0) {
            pxVar3 = (xpath_allocator *)pxVar3[1]._root;
            if (pxVar3 == (xpath_allocator *)0x0) {
              return;
            }
          }
        }
        pxVar3 = pxVar4;
        bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                          (xpath_node_set_raw *)(this->_data).variable,ns,pxVar3);
      } while ((bVar1 & once) != 1);
    }
  }
  else {
    if (((long *)xn)[1] != 0) {
      xml_node::xml_node(&local_38);
      xn = &local_38;
    }
    lVar2 = *(long *)xn;
    do {
      pxVar3 = *(xpath_allocator **)(lVar2 + 0x30);
      if (pxVar3 != (xpath_allocator *)0x0) {
        bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                          (xpath_node_set_raw *)(this->_data).variable,ns,pxVar3);
        do {
          if ((bVar1 & once) != 0) {
            return;
          }
          pxVar4 = (xpath_allocator *)pxVar3[1]._root_size;
          if (pxVar4 == (xpath_allocator *)0x0) {
            while (pxVar4 = (xpath_allocator *)pxVar3[2]._root, pxVar4 == (xpath_allocator *)0x0) {
              pxVar3 = (xpath_allocator *)pxVar3[1]._root;
              if (pxVar3 == (xpath_allocator *)0x0) {
                return;
              }
            }
          }
          bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                            (xpath_node_set_raw *)(this->_data).variable,ns,pxVar4);
          pxVar3 = pxVar4;
        } while( true );
      }
      lVar2 = *(long *)(lVar2 + 0x18);
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}